

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O2

void __thiscall binpac::FlowBuffer::ExpandBuffer(FlowBuffer *this,int length)

{
  int iVar1;
  uchar *puVar2;
  ExceptionFlowBufferAlloc *pEVar3;
  string reason;
  
  if (this->buffer_length_ < length) {
    if (length < DAT_0010512c) {
      length = DAT_0010512c;
    }
    iVar1 = this->buffer_length_ * 2;
    if (iVar1 < length) {
      iVar1 = length;
    }
    if (policy < iVar1) {
      (anonymous_namespace)::strfmt_abi_cxx11_(&reason,"expand past max capacity %d/%d");
      pEVar3 = (ExceptionFlowBufferAlloc *)__cxa_allocate_exception(0x20);
      ExceptionFlowBufferAlloc::ExceptionFlowBufferAlloc(pEVar3,reason._M_dataplus._M_p);
      __cxa_throw(pEVar3,&ExceptionFlowBufferAlloc::typeinfo,Exception::~Exception);
    }
    this->buffer_length_ = iVar1;
    puVar2 = (uchar *)realloc(this->buffer_,(long)iVar1);
    if (puVar2 == (uchar *)0x0) {
      pEVar3 = (ExceptionFlowBufferAlloc *)__cxa_allocate_exception(0x20);
      ExceptionFlowBufferAlloc::ExceptionFlowBufferAlloc(pEVar3,"expand realloc OOM");
      __cxa_throw(pEVar3,&ExceptionFlowBufferAlloc::typeinfo,Exception::~Exception);
    }
    this->buffer_ = puVar2;
  }
  return;
}

Assistant:

void FlowBuffer::ExpandBuffer(int length)
	{
	if ( buffer_length_ >= length )
		return;

	if ( length < policy.min_capacity )
		length = policy.min_capacity;

	if ( length < buffer_length_ * 2 )
		length = buffer_length_ * 2;

	if ( length > policy.max_capacity )
		{
		std::string reason = strfmt("expand past max capacity %d/%d", length, policy.max_capacity);
		throw ExceptionFlowBufferAlloc(reason.c_str());
		}

	// Allocate a new buffer and copy the existing contents
	buffer_length_ = length;
	unsigned char* new_buf = (unsigned char*)realloc(buffer_, buffer_length_);

	if ( ! new_buf )
		throw ExceptionFlowBufferAlloc("expand realloc OOM");

	buffer_ = new_buf;
	}